

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O3

bool __thiscall
cmsys::Glob::RecurseDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pRVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  unsigned_long uVar8;
  char *__s;
  long *plVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_type sVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  RegularExpression *this_00;
  ulong *puVar16;
  bool bVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string fname;
  Directory d;
  string canonicalPath;
  string realname;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  _Alloc_hider local_188;
  undefined1 local_180 [24];
  GlobMessages *local_168;
  string local_160;
  ulong *local_140;
  long local_138;
  ulong local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  string *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong local_d8;
  Directory local_d0;
  string local_c8;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  size_type local_80;
  size_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_168 = messages;
  local_78 = start;
  Directory::Directory(&local_d0);
  local_120 = dir;
  bVar5 = Directory::Load(&local_d0,dir);
  bVar17 = true;
  if (bVar5) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_d8 = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_80 = local_78 + 1;
    local_88 = &this->VisitedSymlinks;
    while( true ) {
      uVar8 = Directory::GetNumberOfFiles(&local_d0);
      bVar17 = uVar8 <= local_d8;
      if (bVar17) break;
      __s = Directory::GetFile(&local_d0,local_d8);
      sVar13 = local_f8._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)sVar13,(ulong)__s);
      iVar7 = std::__cxx11::string::compare((char *)&local_f8);
      if ((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)&local_f8), iVar7 != 0)) {
        if (local_78 == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_190,local_120,&local_f8);
          std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_190);
          sVar13 = local_180._0_8_;
          _Var15._M_p = (pointer)local_190;
          if (local_190 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180) goto LAB_00383fcf;
        }
        else {
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          pcVar1 = (local_120->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,pcVar1,pcVar1 + local_120->_M_string_length);
          std::__cxx11::string::append((char *)&local_160);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_160,(ulong)local_f8._M_dataplus._M_p);
          psVar11 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_180._0_8_ = *psVar11;
            local_180._8_8_ = plVar9[3];
            local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_180;
          }
          else {
            local_180._0_8_ = *psVar11;
            local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9;
          }
          local_188._M_p = (pointer)plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_190);
          if (local_190 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180) {
            operator_delete(local_190,local_180._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            sVar13 = CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                              local_160.field_2._M_local_buf[0]);
            _Var15._M_p = local_160._M_dataplus._M_p;
LAB_00383fcf:
            operator_delete(_Var15._M_p,sVar13 + 1);
          }
        }
        bVar5 = SystemTools::FileIsDirectory(&local_a8);
        bVar6 = SystemTools::FileIsSymlink(&local_a8);
        if (bVar5) {
          if (bVar6) {
            if (this->RecurseThroughSymlinks != true) goto LAB_0038412c;
            this->FollowedSymlinkCount = this->FollowedSymlinkCount + 1;
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            local_160._M_string_length = 0;
            local_160.field_2._M_local_buf[0] = '\0';
            SystemTools::GetRealPath(&local_c8,local_120,&local_160);
            if (local_160._M_string_length != 0) {
              if (local_168 != (GlobMessages *)0x0) {
                std::operator+(&local_50,"Canonical path generation from path \'",local_120);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
                psVar11 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_70.field_2._M_allocated_capacity = *psVar11;
                  local_70.field_2._8_8_ = plVar9[3];
                  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                }
                else {
                  local_70.field_2._M_allocated_capacity = *psVar11;
                  local_70._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_70._M_string_length = plVar9[1];
                *plVar9 = (long)psVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::operator+(&local_118,&local_70,&local_160);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_118);
                puVar16 = (ulong *)(plVar9 + 2);
                if ((ulong *)*plVar9 == puVar16) {
                  local_130 = *puVar16;
                  uStack_128 = (undefined4)plVar9[3];
                  uStack_124 = *(undefined4 *)((long)plVar9 + 0x1c);
                  local_140 = &local_130;
                }
                else {
                  local_130 = *puVar16;
                  local_140 = (ulong *)*plVar9;
                }
                local_138 = plVar9[1];
                *plVar9 = (long)puVar16;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((ulong)local_190 & 0xffffffff00000000);
                local_188._M_p = local_180 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_188,local_140,local_138 + (long)local_140);
                std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::
                emplace_back<cmsys::Glob::Message>(local_168,(Message *)&local_190);
                if (local_188._M_p != local_180 + 8) {
                  operator_delete(local_188._M_p,local_180._8_8_ + 1);
                }
                if (local_140 != &local_130) {
                  operator_delete(local_140,local_130 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_003845cf:
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
LAB_003845d7:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                         local_160.field_2._M_local_buf[0]) + 1);
              }
              break;
            }
            _Var10 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               ((this->VisitedSymlinks).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (this->VisitedSymlinks).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
            pbVar2 = (this->VisitedSymlinks).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (_Var10._M_current == pbVar2) {
              if (this->RecurseListDirs == true) {
                AddFile(this,&this->Internals->Files,&local_a8);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_88,&local_c8);
              bVar5 = RecurseDirectory(this,local_80,&local_a8,local_168);
              pbVar4 = (this->VisitedSymlinks).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              (this->VisitedSymlinks).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
              puVar16 = (ulong *)pbVar4[-1]._M_dataplus._M_p;
              paVar12 = &pbVar4[-1].field_2;
              if (!bVar5) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar16 != paVar12) {
                  local_50.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_50._M_dataplus._M_p = (pointer)puVar16;
                  goto LAB_003845cf;
                }
                goto LAB_003845d7;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar16 != paVar12) {
                uVar14 = paVar12->_M_allocated_capacity;
                goto LAB_003843a7;
              }
            }
            else if (local_168 != (GlobMessages *)0x0) {
              local_140 = &local_130;
              local_138 = 0;
              local_130 = local_130 & 0xffffffffffffff00;
              for (_Var10 = std::
                            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                      ((local_88->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start,pbVar2,&local_c8);
                  _Var10._M_current !=
                  (this->VisitedSymlinks).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
                  _Var10._M_current = _Var10._M_current + 1) {
                pcVar1 = ((_Var10._M_current)->_M_dataplus)._M_p;
                local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,pcVar1,
                           pcVar1 + (_Var10._M_current)->_M_string_length);
                std::__cxx11::string::append((char *)&local_190);
                std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_190);
                if (local_190 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180) {
                  operator_delete(local_190,local_180._0_8_ + 1);
                }
              }
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_118,local_c8._M_dataplus._M_p,
                         local_c8._M_dataplus._M_p + local_c8._M_string_length);
              std::__cxx11::string::append((char *)&local_118);
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_118,(ulong)local_f8._M_dataplus._M_p);
              psVar11 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_180._0_8_ = *psVar11;
                local_180._8_8_ = plVar9[3];
                local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_180;
              }
              else {
                local_180._0_8_ = *psVar11;
                local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar9;
              }
              local_188._M_p = (pointer)plVar9[1];
              *plVar9 = (long)psVar11;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_190);
              if (local_190 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180) {
                operator_delete(local_190,local_180._0_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_190._4_4_,1);
              local_188._M_p = local_180 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_188,local_140,local_138 + (long)local_140);
              std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::
              emplace_back<cmsys::Glob::Message>(local_168,(Message *)&local_190);
              if (local_188._M_p != local_180 + 8) {
                operator_delete(local_188._M_p,local_180._8_8_ + 1);
              }
              uVar14 = local_130;
              puVar16 = local_140;
              if (local_140 != &local_130) {
LAB_003843a7:
                operator_delete(puVar16,uVar14 + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,
                              CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                       local_160.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            if (this->RecurseListDirs == true) {
              AddFile(this,&this->Internals->Files,&local_a8);
            }
            bVar5 = RecurseDirectory(this,local_80,&local_a8,local_168);
            if (!bVar5) break;
          }
        }
        else {
LAB_0038412c:
          pRVar3 = (this->Internals->Expressions).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((this->Internals->Expressions).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_start != pRVar3) &&
             (this_00 = pRVar3 + -1,
             bVar5 = RegularExpression::find(this_00,local_f8._M_dataplus._M_p,&this_00->regmatch),
             bVar5)) {
            AddFile(this,&this->Internals->Files,&local_a8);
          }
        }
      }
      local_d8 = local_d8 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
  }
  Directory::~Directory(&local_d0);
  return bVar17;
}

Assistant:

bool Glob::RecurseDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  kwsys::Directory d;
  if (!d.Load(dir)) {
    return true;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On Windows and Apple, no difference between lower and upper case
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    bool isDir = kwsys::SystemTools::FileIsDirectory(realname);
    bool isSymLink = kwsys::SystemTools::FileIsSymlink(realname);

    if (isDir && (!isSymLink || this->RecurseThroughSymlinks)) {
      if (isSymLink) {
        ++this->FollowedSymlinkCount;
        std::string realPathErrorMessage;
        std::string canonicalPath(
          SystemTools::GetRealPath(dir, &realPathErrorMessage));

        if (!realPathErrorMessage.empty()) {
          if (messages) {
            messages->push_back(
              Message(Glob::error,
                      "Canonical path generation from path '" + dir +
                        "' failed! Reason: '" + realPathErrorMessage + "'"));
          }
          return false;
        }

        if (std::find(this->VisitedSymlinks.begin(),
                      this->VisitedSymlinks.end(),
                      canonicalPath) == this->VisitedSymlinks.end()) {
          if (this->RecurseListDirs) {
            // symlinks are treated as directories
            this->AddFile(this->Internals->Files, realname);
          }

          this->VisitedSymlinks.push_back(canonicalPath);
          if (!this->RecurseDirectory(start + 1, realname, messages)) {
            this->VisitedSymlinks.pop_back();

            return false;
          }
          this->VisitedSymlinks.pop_back();
        }
        // else we have already visited this symlink - prevent cyclic recursion
        else if (messages) {
          std::string message;
          for (std::vector<std::string>::const_iterator pathIt =
                 std::find(this->VisitedSymlinks.begin(),
                           this->VisitedSymlinks.end(), canonicalPath);
               pathIt != this->VisitedSymlinks.end(); ++pathIt) {
            message += *pathIt + "\n";
          }
          message += canonicalPath + "/" + fname;
          messages->push_back(Message(Glob::cyclicRecursion, message));
        }
      } else {
        if (this->RecurseListDirs) {
          this->AddFile(this->Internals->Files, realname);
        }
        if (!this->RecurseDirectory(start + 1, realname, messages)) {
          return false;
        }
      }
    } else {
      if (!this->Internals->Expressions.empty() &&
          this->Internals->Expressions.back().find(fname)) {
        this->AddFile(this->Internals->Files, realname);
      }
    }
  }

  return true;
}